

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O1

void CVmSaveFile::reset(void)

{
  long lVar1;
  void *pvVar2;
  int enable;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_108 [2];
  long local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  
  CVmUndo::drop_undo(G_undo_X);
  CVmImageLoader::discard_synth_exports(G_image_loader_X);
  CVmMetaTable::forget_intrinsic_class_instances(G_meta_table_X);
  CVmObjTable::gc_full(&G_obj_table_X);
  enable = CVmObjTable::enable_gc(&G_obj_table_X,0);
  G_err_frame::__tls_init();
  local_100 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_108;
  local_108[0] = _setjmp(&local_f0);
  if (local_108[0] == 0) {
    CVmObjTable::reset_to_image(&G_obj_table_X);
    CVmImageLoader::do_dynamic_link(G_image_loader_X);
  }
  if (-1 < (short)local_108[0]) {
    local_108[0] = local_108[0] | 0x8000;
    CVmObjTable::enable_gc(&G_obj_table_X,enable);
  }
  lVar1 = local_100;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_108[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_f8;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  CVmMetaTable::create_intrinsic_class_instances(G_meta_table_X);
  CVmObjTable::do_all_post_load_init(&G_obj_table_X);
  CVmObjTable::gc_full(&G_obj_table_X);
  CVmImageLoader::run_static_init(G_image_loader_X);
  return;
}

Assistant:

void CVmSaveFile::reset(VMG0_)
{
    /* 
     *   discard undo information, since it applies only to the current VM
     *   state and obviously is no longer relevant after we reset to the
     *   initial state 
     */
    G_undo->drop_undo(vmg0_);

    /* 
     *   discard all synthesized exports, since we want to dynamically link
     *   to the base image file state 
     */
    G_image_loader->discard_synth_exports();

    /* forget any IntrinsicClass instances we created at startup */
	G_meta_table->forget_intrinsic_class_instances(vmg0_);

	/* 
	 *   Run GC explicitly to clear dead objects, then disable GC for the
	 *   duration of the reset.  The dynamic link step can trigger object
	 *   creation, which can trigger GC if it's enabled, but there are
	 *   assumptions (in CVmObjTADS and probably elsewhere) that GC can't
	 *   happen during image loading, and reset is a kind of loading.
	 */
	G_obj_table->gc_full(vmg0_);
	int gc_was_enabled = G_obj_table->enable_gc(vmg_ FALSE);

    err_try
	{
		/* reset all objects to initial image file load state */
		G_obj_table->reset_to_image(vmg0_);

		/* 
		 *   forget the previous dynamic linking information and relink to
		 *   the image file again - this will ensure that any objects created
		 *   after load are properly re-created now 
		 */
		G_image_loader->do_dynamic_link(vmg0_);
	}